

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

uint32_t svb_select_scalar_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  if (-1 < slot) {
    uVar1 = (uint)*keyPtr;
    pbVar2 = keyPtr + 1;
    iVar3 = slot + 1;
    uVar4 = 0;
    do {
      if ((char)uVar4 == '\b') {
        uVar1 = (uint)*pbVar2;
        pbVar2 = pbVar2 + 1;
        uVar4 = 0;
      }
      switch(uVar1 >> (uVar4 & 0x1f) & 3) {
      case 0:
        uVar5 = (uint)(byte)*(uint *)dataPtr;
        lVar6 = 1;
        break;
      case 1:
        uVar5 = (uint)(ushort)*(uint *)dataPtr;
        lVar6 = 2;
        break;
      case 2:
        uVar5 = (uint)(uint3)*(uint *)dataPtr;
        lVar6 = 3;
        break;
      case 3:
        uVar5 = *(uint *)dataPtr;
        lVar6 = 4;
      }
      prev = prev + uVar5;
      dataPtr = (uint8_t *)((long)dataPtr + lVar6);
      uVar4 = (uint)(byte)((char)uVar4 + 2);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return prev;
}

Assistant:

uint32_t svb_select_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   uint64_t count, uint32_t prev, int slot) {
  uint8_t shift = 0;
  uint32_t key = *keyPtr++;

  (void)count;

  // make sure that the loop is run at least once
  for (int c = 0; c <= slot; c++) {
    if (shift == 8) {
      shift = 0;
      key = *keyPtr++;
    }
    prev += _decode_data(&dataPtr, (key >> shift) & 0x3);
    shift += 2;
  }

  return prev;
}